

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromaclique.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Kind KVar1;
  _Elt_pointer ppAVar2;
  double dVar3;
  double uniqueSupportFilter;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  string *psVar9;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar10;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar11;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar12;
  undefined8 uVar13;
  _Alloc_hider insert_size_mean;
  pointer pbVar14;
  _Alloc_hider insert_size_stddev;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ostream *poVar21;
  mapped_type *pmVar22;
  string *psVar23;
  istream *piVar24;
  mapped_type *pmVar25;
  clock_t cVar26;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *pdVar27;
  GaussianEdgeCalculator *this;
  long *this_00;
  LogWriter *pLVar28;
  CLEVER *this_01;
  size_type sVar29;
  difference_type dVar30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var31;
  iterator iVar32;
  mapped_type *pmVar33;
  AlignmentRecord *pAVar34;
  iterator iVar35;
  clock_t cVar36;
  string *psVar37;
  AlignmentRecord *pAVar38;
  pointer pbVar39;
  _Elt_pointer ppAVar40;
  ostream *this_02;
  uint uVar41;
  _Base_ptr p_Var42;
  _Base_ptr p_Var43;
  _Map_pointer pppAVar44;
  _Base_ptr p_Var45;
  _Base_ptr p_Var46;
  long lVar47;
  int iVar48;
  AlignmentRecord **r;
  AlignmentRecord *pAVar49;
  _Elt_pointer ppAVar50;
  deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *__range1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  trueReadsUniqueSupportMap;
  AlignmentRecord *local_1130;
  double local_1128;
  int nonEdgeCounter;
  int edgecounter;
  undefined1 local_1118 [32];
  NoMeEdgeCalculator *local_10f8;
  LogWriter *local_10f0;
  _Base_ptr local_10e8;
  int local_10e0;
  uint maxPosition1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> errorReadsSupportMap;
  string outfile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  readCountMap;
  unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  readgroup_params;
  double filter;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  errorReadsUniqueSupportMap;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> trueReadsSupportMap;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  originalReadNames;
  ofstream os;
  value local_f48 [12];
  RefVector references;
  undefined1 local_d28 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d20;
  string mean_and_sd_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  consistingReads_1;
  string logfile;
  string indel_output_file;
  string allel_frequencies_path;
  CliqueCollector collector;
  string reference_path;
  string local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string bamfile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  appearanceMap;
  string ia_line;
  string indel_edge_cutoff;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  simpson_map;
  is_any_ofF<char> local_8d8;
  is_any_ofF<char> local_8c0;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_8a8;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_870;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateRS;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  switchRateFS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  insertion_words;
  ofstream osSupportTrue;
  undefined4 uStack_3c4;
  const_iterator local_1c8;
  const_iterator local_1a8;
  SamHeader header;
  
  poVar21 = std::operator<<((ostream *)&std::cout,"in main");
  std::endl<char,std::char_traits<char>>(poVar21);
  std::__cxx11::string::string
            ((string *)&os,
             "ChromaClique predicts nucleosome patterns NOMe-sequencing reads.\n\nUsage:\n  chromaclique [options] [--] <bamfile> [<output>]\nOptions:\n  -i NUM --iterations=NUM                  Number of iterations.\n                                           chromaclique will stop if the\n                                           superreads converge.\n                                           [default: -1]\n  -n --no_singletons                       Filter out single read cliques\n                                           after first iteration.\n  -L FILE --log=FILE                       Write log to <file>.\n  -bam --bam                               Option to create BAM File from output. <output> is used as prefix.\n  -nome --nome                             Option for NoMe Mode\n  -nP NUM --nomeParam=NUM                  Number of similar GC regions required for merging reads\n  -minOv NUM --minOverlap=NUM              minimum number of GC allowed in the overlapping regions\n  -R FILE --ref=FILE                       Reference File\n  -R FILE --FS=FILE                        Switch rates for the Forward strand\n  -R FILE --RS=FILE                        Switch rates for the Reverse strand\n  -unique NUM --uniqueSupportFilter=NUM    Filtering based on the specified number of unique support for each clique\n  -analysisFiles --analysisFiles           Option For creating analysis Files\n\n\n"
             ,(allocator *)&insertion_words);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&words,argv + 1,
             argv + argc,(allocator_type *)&osSupportTrue);
  ia_line._M_dataplus._M_p = (pointer)&ia_line.field_2;
  ia_line._M_string_length = 0;
  ia_line.field_2._M_allocated_capacity = ia_line.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  docopt::docopt(&args,(string *)&os,&words,false,&ia_line,false);
  std::__cxx11::string::~string((string *)&ia_line);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  std::__cxx11::string::~string((string *)&os);
  for (; (_Rb_tree_header *)args._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
         &args._M_t._M_impl.super__Rb_tree_header;
      args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           std::_Rb_tree_increment(args._M_t._M_impl.super__Rb_tree_header._M_header._M_left)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
            *)&os,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
                   *)(args._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    poVar21 = std::operator<<((ostream *)&std::cout,(string *)&os);
    poVar21 = std::operator<<(poVar21," ");
    poVar21 = docopt::operator<<(poVar21,local_f48);
    std::operator<<(poVar21,"\n");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>
             *)&os);
  }
  std::__cxx11::string::string((string *)&os,"<bamfile>",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  std::__cxx11::string::string((string *)&bamfile,(string *)psVar23);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&outfile,"chromatypes.fasta",(allocator *)&os);
  std::__cxx11::string::string((string *)&os,"<output>",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 != Empty) {
    std::__cxx11::string::string((string *)&os,"<output>",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    docopt::value::asString_abi_cxx11_(pmVar22);
    std::__cxx11::string::_M_assign((string *)&outfile);
    std::__cxx11::string::~string((string *)&os);
  }
  std::__cxx11::string::string((string *)&allel_frequencies_path,"",(allocator *)&os);
  std::__cxx11::string::string((string *)&os,"--allel_frequencies",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 != Empty) {
    std::__cxx11::string::string((string *)&os,"--allel_frequencies",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    docopt::value::asString_abi_cxx11_(pmVar22);
    std::__cxx11::string::_M_assign((string *)&allel_frequencies_path);
    std::__cxx11::string::~string((string *)&os);
  }
  std::__cxx11::string::string((string *)&mean_and_sd_filename,"",(allocator *)&os);
  std::__cxx11::string::string((string *)&os,"--mean_and_sd_filename",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 != Empty) {
    std::__cxx11::string::string((string *)&os,"--mean_and_sd_filename",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    docopt::value::asString_abi_cxx11_(pmVar22);
    std::__cxx11::string::_M_assign((string *)&mean_and_sd_filename);
    std::__cxx11::string::~string((string *)&os);
  }
  indel_edge_cutoff._M_dataplus._M_p = (pointer)&indel_edge_cutoff.field_2;
  indel_edge_cutoff._M_string_length = 0;
  indel_edge_cutoff.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&indel_output_file,"",(allocator *)&os);
  std::__cxx11::string::string((string *)&os,"--call_indels",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 != Empty) {
    std::__cxx11::string::string((string *)&os,"--call_indels",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    docopt::value::asString_abi_cxx11_(pmVar22);
    std::__cxx11::string::_M_assign((string *)&indel_output_file);
    std::__cxx11::string::~string((string *)&os);
  }
  std::__cxx11::string::string((string *)&os,"--iterations",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  uVar18 = std::__cxx11::stoi(psVar23,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&os);
  filter = 0.0;
  std::__cxx11::string::string((string *)&os,"--no_singletons",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  bVar15 = docopt::value::asBool(pmVar22);
  local_10e8 = (_Base_ptr)CONCAT71(local_10e8._1_7_,bVar15);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&logfile,"",(allocator *)&os);
  std::__cxx11::string::string((string *)&os,"--log",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 != Empty) {
    std::__cxx11::string::string((string *)&os,"--log",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    docopt::value::asString_abi_cxx11_(pmVar22);
    std::__cxx11::string::_M_assign((string *)&logfile);
    std::__cxx11::string::~string((string *)&os);
  }
  std::__cxx11::string::string((string *)&os,"--doc_haplotypes",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 == Empty) {
    local_10e0 = 0;
  }
  else {
    std::__cxx11::string::string((string *)&os,"--doc_haplotypes",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
    local_10e0 = std::__cxx11::stoi(psVar23,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&os);
  }
  std::__cxx11::string::string((string *)&os,"--bam",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  bVar15 = docopt::value::asBool(pmVar22);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"--analysisFiles",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  bVar16 = docopt::value::asBool(pmVar22);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"--nome",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  bVar17 = docopt::value::asBool(pmVar22);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"--nomeParam",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  dVar3 = std::__cxx11::stod(psVar23,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"--uniqueSupportFilter",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  uniqueSupportFilter = std::__cxx11::stod(psVar23,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"--minOverlap",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  dVar4 = std::__cxx11::stod(psVar23,(size_t *)0x0);
  std::__cxx11::string::~string((string *)&os);
  reference_path._M_dataplus._M_p = (pointer)&reference_path.field_2;
  reference_path._M_string_length = 0;
  reference_path.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&os,"--ref",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  KVar1 = pmVar22->kind;
  std::__cxx11::string::~string((string *)&os);
  if (KVar1 != Empty) {
    std::__cxx11::string::string((string *)&os,"--ref",(allocator *)&ia_line);
    pmVar22 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
              ::operator[](&args,(key_type *)&os);
    docopt::value::asString_abi_cxx11_(pmVar22);
    std::__cxx11::string::_M_assign((string *)&reference_path);
    std::__cxx11::string::~string((string *)&os);
  }
  std::__cxx11::string::string((string *)&os,"--FS",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  std::__cxx11::string::string((string *)&local_ba0,(string *)psVar23);
  readSwitchRateFile(&switchRateFS,&local_ba0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::string((string *)&os,"--RS",(allocator *)&ia_line);
  pmVar22 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
            ::operator[](&args,(key_type *)&os);
  psVar23 = docopt::value::asString_abi_cxx11_(pmVar22);
  std::__cxx11::string::string((string *)&local_bc0,(string *)psVar23);
  readSwitchRateFile(&switchRateRS,&local_bc0);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&os);
  if ((indel_output_file._M_string_length != 0) && (mean_and_sd_filename._M_string_length == 0)) {
    poVar21 = std::operator<<((ostream *)&std::cerr,
                              "Error: when using option -I, option -M must also be given.");
    std::endl<char,std::char_traits<char>>(poVar21);
    iVar19 = 1;
    goto LAB_00168ab0;
  }
  simpson_map._M_h._M_buckets = &simpson_map._M_h._M_single_bucket;
  simpson_map._M_h._M_bucket_count = 1;
  simpson_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  simpson_map._M_h._M_element_count = 0;
  simpson_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  simpson_map._M_h._M_rehash_policy._M_next_resize = 0;
  simpson_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::ostream::flush();
  if (allel_frequencies_path._M_string_length == 0) {
    __range1._0_4_ = 0;
    pLVar28 = (LogWriter *)indel_output_file._M_string_length;
  }
  else {
    local_10f0 = (LogWriter *)indel_output_file._M_string_length;
    std::ifstream::ifstream(&os,allel_frequencies_path._M_dataplus._M_p,_S_in);
    ia_line._M_dataplus._M_p = (pointer)&ia_line.field_2;
    ia_line._M_string_length = 0;
    ia_line.field_2._M_allocated_capacity =
         ia_line.field_2._M_allocated_capacity & 0xffffffffffffff00;
    __range1 = (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)0x0;
    while (piVar24 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&os,(string *)&ia_line),
          ((byte)piVar24[*(long *)(*(long *)piVar24 + -0x18) + 0x20] & 5) == 0) {
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::locale::locale((locale *)&insertion_words);
      boost::algorithm::trim_right<std::__cxx11::string>(&ia_line,(locale *)&insertion_words);
      std::locale::~locale((locale *)&insertion_words);
      boost::algorithm::is_any_of<char[2]>(&local_8c0,(char (*) [2])0x1ae618);
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                (&words,&ia_line,&local_8c0,token_compress_on);
      boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_8c0);
      pbVar14 = words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      insertion_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      insertion_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      insertion_words.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      boost::algorithm::is_any_of<char[3]>(&local_8d8,(char (*) [3])"\\.");
      boost::algorithm::
      split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                (&insertion_words,pbVar14,&local_8d8,token_compress_on);
      boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_8d8);
      pbVar14 = words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)insertion_words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)insertion_words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        dVar5 = atof(words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        dVar6 = atof(pbVar14[2]._M_dataplus._M_p);
        dVar7 = atof(pbVar14[3]._M_dataplus._M_p);
        dVar8 = atof(pbVar14[4]._M_dataplus._M_p);
        dVar5 = log10(dVar8 * dVar8 + dVar7 * dVar7 + dVar6 * dVar6 + dVar5 * dVar5);
        iVar19 = atoi(((words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        _osSupportTrue = iVar19;
        pmVar25 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&simpson_map,(key_type *)&osSupportTrue);
        *pmVar25 = dVar5;
        uVar20 = atoi(((words.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
        __range1 = (deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *)(ulong)uVar20;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&insertion_words);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&words);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&ia_line);
    std::ifstream::~ifstream(&os);
    pLVar28 = local_10f0;
  }
  cVar26 = clock();
  originalReadNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  originalReadNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  originalReadNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&os,"",(allocator *)&ia_line);
  BamTools::SamHeader::SamHeader(&header,(string *)&os);
  std::__cxx11::string::~string((string *)&os);
  references.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  references.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  references.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_be0,(string *)&bamfile);
  std::__cxx11::string::string((string *)&local_c00,(string *)&reference_path);
  pdVar27 = readBamFile(&local_be0,&originalReadNames,&maxPosition1,&header,&references,&local_c00);
  std::__cxx11::string::~string((string *)&local_c00);
  std::__cxx11::string::~string((string *)&local_be0);
  readgroup_params._M_t.
  super___uniq_ptr_impl<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_*,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  .
  super__Head_base<0UL,_std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
          )0x0;
  if ((uint)__range1 < maxPosition1) {
    __range1._0_4_ = maxPosition1;
  }
  maxPosition1 = (uint)__range1;
  if (bVar17) {
    local_10f8 = (NoMeEdgeCalculator *)operator_new(0x80);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_870,&switchRateFS._M_h);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_8a8,&switchRateRS._M_h);
    NoMeEdgeCalculator::NoMeEdgeCalculator
              (local_10f8,dVar3,
               (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                *)&local_870,
               (unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
                *)&local_8a8);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_8a8);
    std::
    _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_870);
  }
  else {
    local_10f8 = (NoMeEdgeCalculator *)operator_new(0x70);
    NewEdgeCalculator::NewEdgeCalculator
              ((NewEdgeCalculator *)local_10f8,0.9,0.99,0.9,false,&simpson_map,0.95,0.6,0.97,
               (uint)__range1,false);
  }
  if (pLVar28 == (LogWriter *)0x0) {
    this = (GaussianEdgeCalculator *)0x0;
    this_00 = (long *)0x0;
LAB_00167ee7:
    bVar17 = std::operator!=(&logfile,"");
    if (bVar17) {
      pLVar28 = (LogWriter *)operator_new(0x290);
      std::__cxx11::string::string((string *)&local_c20,(string *)&logfile);
      LogWriter::LogWriter(pLVar28,&local_c20);
      std::__cxx11::string::~string((string *)&local_c20);
    }
    else {
      pLVar28 = (LogWriter *)0x0;
    }
    local_10f0 = pLVar28;
    CliqueCollector::CliqueCollector(&collector,pLVar28);
    this_01 = (CLEVER *)operator_new(0x90);
    CLEVER::CLEVER(this_01,&local_10f8->super_EdgeCalculator,&collector,local_10f0);
    if (this != (GaussianEdgeCalculator *)0x0) {
      (*(this_01->super_CliqueFinder)._vptr_CliqueFinder[6])(this_01,this);
    }
    edgecounter = 0;
    nonEdgeCounter = 0;
    poVar21 = std::operator<<((ostream *)&std::cout,"start: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
    appearanceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &appearanceMap._M_t._M_impl.super__Rb_tree_header._M_header;
    appearanceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    appearanceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    uVar20 = (uint)dVar4;
    appearanceMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1128 = 1.0;
    pLVar28 = local_10f0;
    __range1 = pdVar27;
    appearanceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         appearanceMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (uVar41 = 0; uVar41 != uVar18; uVar41 = uVar41 + 1) {
      if (appearanceMap._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::clear(&appearanceMap._M_t);
      }
      (*(this_01->super_CliqueFinder)._vptr_CliqueFinder[3])(this_01,&appearanceMap._M_t);
      if (pLVar28 != (LogWriter *)0x0) {
        LogWriter::initialize(pLVar28);
      }
      sVar29 = std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size(__range1);
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size(__range1);
      while (ppAVar40 = (__range1->
                        super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_cur,
            (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
            _M_impl.super__Deque_impl_data._M_finish._M_cur != ppAVar40) {
        _os = (pointer)*ppAVar40;
        std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::pop_front(__range1);
        if (uVar41 == 0) {
LAB_0016811b:
          (*(this_01->super_CliqueFinder)._vptr_CliqueFinder[2])
                    (this_01,&os,&edgecounter,&nonEdgeCounter,(ulong)uVar20,(ulong)uVar41);
        }
        else if (uVar41 == 1) {
          if (((char)local_10e8 == '\0') || ((*(size_t *)(_os + 0x1b0) & 0xfffffffe) != 0))
          goto LAB_0016811b;
        }
        else {
          dVar3 = AlignmentRecord::getProbability((AlignmentRecord *)_os);
          if (local_1128 * -3.0 + 1.0 / (double)(int)sVar29 <= dVar3) goto LAB_0016811b;
        }
        std::unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_>::~unique_ptr
                  ((unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *)&os);
      }
      poVar21 = std::operator<<((ostream *)&std::cout,"\tedges: ");
      std::ostream::operator<<((ostream *)poVar21,edgecounter);
      poVar21 = std::operator<<((ostream *)&std::cout,"\tnonEdges: ");
      poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,nonEdgeCounter);
      std::endl<char,std::char_traits<char>>(poVar21);
      std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
                (&__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
                );
      pLVar28 = local_10f0;
      operator_delete(__range1);
      (*(this_01->super_CliqueFinder)._vptr_CliqueFinder[4])();
      __range1 = CliqueCollector::finish(&collector);
      if (pLVar28 != (LogWriter *)0x0) {
        LogWriter::finish(pLVar28);
      }
      local_1128 = setProbabilities(__range1);
      iVar19 = (*(this_01->super_CliqueFinder)._vptr_CliqueFinder[7])();
      if ((char)iVar19 != '\0') break;
      poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar41);
      poVar21 = std::operator<<(poVar21,": ");
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size(__range1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
      uVar20 = uVar20 - (2 < (int)uVar20);
      edgecounter = 0;
      nonEdgeCounter = 0;
    }
    if (0.0 < filter) {
      pAVar34 = (AlignmentRecord *)
                (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_node;
      trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_1118._0_8_ = &filter;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_last;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_node;
      pmVar10 = &errorReadsSupportMap;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_first;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_last;
      errorReadsSupportMap._M_t._M_impl._0_8_ = pAVar34;
      errorReadsUniqueSupportMap._M_t._M_impl._0_8_ = local_1118._0_8_;
      dVar30 = std::operator-((_Self *)&errorReadsSupportMap,(_Self *)&trueReadsUniqueSupportMap);
      for (lVar47 = dVar30 >> 2; 0 < lVar47; lVar47 = lVar47 + -1) {
        _os = (pointer)trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
        bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                           ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                            (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                             *)&os);
        if (bVar17) goto LAB_001686a5;
        trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
             trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8;
        if ((_Base_ptr)trueReadsUniqueSupportMap._M_t._M_impl._0_8_ ==
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
               (trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
               _M_parent;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 0x200);
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                _M_parent;
        }
        ia_line._M_dataplus._M_p = (pointer)trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
        ia_line._M_string_length =
             trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        ia_line.field_2._M_allocated_capacity =
             (size_type)
             trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        ia_line.field_2._8_8_ =
             trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                           ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                            (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                             *)&ia_line);
        if (bVar17) goto LAB_001686a5;
        trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
             trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8;
        if ((_Base_ptr)trueReadsUniqueSupportMap._M_t._M_impl._0_8_ ==
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
               (trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
               _M_parent;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 0x200);
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                _M_parent;
        }
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
        bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                           ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                            (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                             *)&words);
        if (bVar17) goto LAB_001686a5;
        trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
             trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8;
        if ((_Base_ptr)trueReadsUniqueSupportMap._M_t._M_impl._0_8_ ==
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
               (trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
               _M_parent;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 0x200);
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                _M_parent;
        }
        insertion_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
        insertion_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
        insertion_words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_parent;
        bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                           ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                            (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                             *)&insertion_words);
        if (bVar17) goto LAB_001686a5;
        trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
             trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8;
        if ((_Base_ptr)trueReadsUniqueSupportMap._M_t._M_impl._0_8_ ==
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
          trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
               (trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
               _M_parent;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 0x200);
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
          trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                _M_parent;
        }
      }
      dVar30 = std::operator-((_Self *)&errorReadsSupportMap,(_Self *)&trueReadsUniqueSupportMap);
      if (dVar30 == 3) {
        _osSupportTrue = (pointer)trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
        bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                           ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                            (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                             *)&osSupportTrue);
        if (!bVar17) {
          trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
               trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8;
          if ((_Base_ptr)trueReadsUniqueSupportMap._M_t._M_impl._0_8_ ==
              trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
                 (trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                 _M_parent;
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 0x200);
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)
                 &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                  _M_parent;
          }
          goto LAB_00168603;
        }
LAB_001686a5:
        pmVar10 = &trueReadsUniqueSupportMap;
        pmVar11 = &trueReadsUniqueSupportMap;
        pmVar12 = &trueReadsUniqueSupportMap;
        pAVar38 = (AlignmentRecord *)trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
      }
      else {
        if (dVar30 == 2) {
LAB_00168603:
          readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
          readCountMap._M_t._M_impl._0_8_ = trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
          readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                             ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                              (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                               *)&readCountMap);
          if (!bVar17) {
            trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
                 trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8;
            if ((_Base_ptr)trueReadsUniqueSupportMap._M_t._M_impl._0_8_ ==
                trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              trueReadsUniqueSupportMap._M_t._M_impl._0_8_ =
                   (trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
                   ->_M_parent;
              trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 0x200);
              trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
              trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)
                   &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
                    ->_M_parent;
            }
            goto LAB_00168673;
          }
          goto LAB_001686a5;
        }
        if (dVar30 == 1) {
LAB_00168673:
          trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
          trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_;
          trueReadsSupportMap._M_t._M_impl._0_8_ = trueReadsUniqueSupportMap._M_t._M_impl._0_8_;
          trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                             ((_Iter_pred<main::__1> *)&errorReadsUniqueSupportMap,
                              (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                               *)&trueReadsSupportMap);
          if (bVar17) goto LAB_001686a5;
          if ((_Base_ptr)(trueReadsUniqueSupportMap._M_t._M_impl._0_8_ + 8) ==
              trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
            trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)
                 &(trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left)->
                  _M_parent;
          }
        }
        pmVar11 = &errorReadsSupportMap;
        pmVar12 = &errorReadsSupportMap;
        pAVar38 = (AlignmentRecord *)errorReadsSupportMap._M_t._M_impl._0_8_;
      }
      local_1130 = *(AlignmentRecord **)&(pmVar10->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var46 = (pmVar11->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var42 = (pmVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var43 = p_Var42;
      if (pAVar38 != pAVar34) {
        pAVar49 = (AlignmentRecord *)&(pAVar38->name)._M_string_length;
        p_Var45 = p_Var46;
        local_10e8 = p_Var42;
        if (pAVar49 != (AlignmentRecord *)p_Var46) goto LAB_00168b5d;
        pAVar49 = (AlignmentRecord *)p_Var42->_M_parent;
        do {
          p_Var42 = (_Base_ptr)&p_Var42->_M_parent;
          p_Var45 = (_Base_ptr)&pAVar49->reference_seq2;
LAB_00168b5d:
          do {
            p_Var43 = local_10e8;
            if (pAVar49 == pAVar34) goto LAB_00168bf9;
            _os = (pointer)pAVar49;
            bVar17 = __gnu_cxx::__ops::_Iter_pred<main::$_1>::operator()
                               ((_Iter_pred<main::__1> *)local_1118,
                                (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>
                                 *)&os);
            if (!bVar17) {
              (pAVar38->name)._M_dataplus._M_p = (pAVar49->name)._M_dataplus._M_p;
              pAVar38 = (AlignmentRecord *)&(pAVar38->name)._M_string_length;
              if (pAVar38 == (AlignmentRecord *)p_Var46) {
                pAVar38 = (AlignmentRecord *)local_10e8->_M_parent;
                local_10e8 = (_Base_ptr)&local_10e8->_M_parent;
                p_Var46 = (_Base_ptr)&pAVar38->reference_seq2;
                local_1130 = pAVar38;
              }
            }
            pAVar49 = (AlignmentRecord *)&(pAVar49->name)._M_string_length;
          } while (pAVar49 != (AlignmentRecord *)p_Var45);
          pAVar49 = (AlignmentRecord *)p_Var42->_M_parent;
        } while( true );
      }
LAB_00168bf9:
      _os = (pointer)pAVar38;
      while (local_1c8._M_cur =
                  (__range1->
                  super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur, (_Elt_pointer)_os != local_1c8._M_cur) {
        pAVar34 = *(AlignmentRecord **)_os;
        if (pAVar34 != (AlignmentRecord *)0x0) {
          AlignmentRecord::~AlignmentRecord(pAVar34);
        }
        operator_delete(pAVar34);
        _os[0] = '\0';
        _os[1] = '\0';
        _os[2] = '\0';
        _os[3] = '\0';
        _os[4] = '\0';
        _os[5] = '\0';
        _os[6] = '\0';
        _os[7] = '\0';
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                  ((_Self *)&ia_line,
                   (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)&os
                   ,0);
      }
      local_1c8._M_node =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_node;
      local_1c8._M_first =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_first;
      local_1c8._M_last =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_finish._M_last;
      local_1a8._M_cur = (_Elt_pointer)pAVar38;
      local_1a8._M_first = (_Elt_pointer)local_1130;
      local_1a8._M_last = (_Elt_pointer)p_Var46;
      local_1a8._M_node = (_Map_pointer)p_Var43;
      std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::erase
                ((iterator *)&os,__range1,&local_1a8,&local_1c8);
    }
    std::operator+(&ia_line,&outfile,".fasta");
    std::ofstream::ofstream(&os,(string *)&ia_line,_S_out);
    std::__cxx11::string::~string((string *)&ia_line);
    setProbabilities(__range1);
    if (-1.0 < uniqueSupportFilter) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &insertion_words,&outfile,"UniqueError");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&words,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &insertion_words,".txt");
      std::ofstream::ofstream(&ia_line,(string *)&words,_S_out);
      std::__cxx11::string::~string((string *)&words);
      std::__cxx11::string::~string((string *)&insertion_words);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &osSupportTrue,&outfile,"UniqueTrue");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &insertion_words,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &osSupportTrue,".txt");
      std::ofstream::ofstream(&words,(string *)&insertion_words,_S_out);
      std::__cxx11::string::~string((string *)&insertion_words);
      std::__cxx11::string::~string((string *)&osSupportTrue);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &readCountMap,&outfile,"SupportError");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &osSupportTrue,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &readCountMap,".txt");
      std::ofstream::ofstream(&insertion_words,(string *)&osSupportTrue,_S_out);
      std::__cxx11::string::~string((string *)&osSupportTrue);
      std::__cxx11::string::~string((string *)&readCountMap);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &trueReadsSupportMap,&outfile,"SupportTrue");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &readCountMap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &trueReadsSupportMap,".txt");
      std::ofstream::ofstream(&osSupportTrue,(string *)&readCountMap,_S_out);
      std::__cxx11::string::~string((string *)&readCountMap);
      std::__cxx11::string::~string((string *)&trueReadsSupportMap);
      readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readCountMap._M_t._M_impl.super__Rb_tree_header._M_header;
      readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readCountMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      trueReadsSupportMap._M_t._M_impl._0_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_first;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_last;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_node;
      readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readCountMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Elt_pointer)trueReadsSupportMap._M_t._M_impl._0_8_ !=
             (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur) {
        AlignmentRecord::getConsistingReads_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&errorReadsUniqueSupportMap,
                   *(AlignmentRecord **)trueReadsSupportMap._M_t._M_impl._0_8_);
        psVar9 = (string *)
                 CONCAT44(errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header.
                          _4_4_,errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header.
                                _M_header._M_color);
        for (psVar37 = (string *)errorReadsUniqueSupportMap._M_t._M_impl._0_8_; psVar37 != psVar9;
            psVar37 = psVar37 + 0x20) {
          std::__cxx11::string::string((string *)&trueReadsUniqueSupportMap,psVar37);
          lVar47 = std::__cxx11::string::find((char *)&trueReadsUniqueSupportMap,0x1ae81a);
          if ((lVar47 == -1) &&
             (lVar47 = std::__cxx11::string::find((char *)&trueReadsUniqueSupportMap,0x1ae81e),
             lVar47 == -1)) {
            std::__cxx11::string::string
                      ((string *)&errorReadsSupportMap,(string *)&trueReadsUniqueSupportMap);
            uVar13 = errorReadsSupportMap._M_t._M_impl._0_8_;
            _Var31 = std::
                     __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                               (errorReadsSupportMap._M_t._M_impl._0_8_,
                                errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header.
                                _0_8_ + errorReadsSupportMap._M_t._M_impl._0_8_,isspace);
            std::__cxx11::string::erase((key_type *)&errorReadsSupportMap,uVar13,_Var31._M_current);
            local_d20.current._M_current =
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ +
                   errorReadsSupportMap._M_t._M_impl._0_8_);
            local_d28 = (undefined1  [8])errorReadsSupportMap._M_t._M_impl._0_8_;
            std::
            find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
                      ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1118,&local_d20,
                       (unary_negate<std::pointer_to_unary_function<int,_int>_>)local_d28);
            std::__cxx11::string::erase
                      ((key_type *)&errorReadsSupportMap,local_1118._0_8_,
                       errorReadsSupportMap._M_t._M_impl._0_8_ +
                       errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
            iVar32 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find(&readCountMap._M_t,(key_type *)&errorReadsSupportMap);
            if ((_Rb_tree_header *)iVar32._M_node ==
                &readCountMap._M_t._M_impl.super__Rb_tree_header) {
              pmVar33 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](&readCountMap,(key_type *)&errorReadsSupportMap);
              *pmVar33 = 1;
            }
            else {
              pmVar33 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](&readCountMap,(key_type *)&errorReadsSupportMap);
              iVar19 = *pmVar33;
              pmVar33 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](&readCountMap,(key_type *)&errorReadsSupportMap);
              *pmVar33 = iVar19 + 1;
            }
            std::__cxx11::string::~string((string *)&errorReadsSupportMap);
          }
          std::__cxx11::string::~string((string *)&trueReadsUniqueSupportMap);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&errorReadsUniqueSupportMap);
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                  ((_Self *)&trueReadsUniqueSupportMap,
                   (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                   &trueReadsSupportMap,0);
      }
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header;
      errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_1118._0_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1118._8_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_first;
      local_1118._16_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_last;
      local_1118._24_8_ =
           (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
           _M_impl.super__Deque_impl_data._M_start._M_node;
      _Var31._M_current = (char *)trueReadsSupportMap._M_t._M_impl._0_8_;
      trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((char *)local_1118._0_8_ != _Var31._M_current) {
        AlignmentRecord::getConsistingReads_abi_cxx11_
                  (&consistingReads_1,*(AlignmentRecord **)local_1118._0_8_);
        pbVar14 = consistingReads_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        iVar48 = 0;
        iVar19 = 0;
        for (pbVar39 = consistingReads_1.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar39 != pbVar14;
            pbVar39 = pbVar39 + 1) {
          std::__cxx11::string::string((string *)&s_1,(string *)pbVar39);
          lVar47 = std::__cxx11::string::find((char *)&s_1,0x1ae81a);
          if ((lVar47 == -1) &&
             (lVar47 = std::__cxx11::string::find((char *)&s_1,0x1ae81e), lVar47 == -1)) {
            pmVar33 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[](&readCountMap,(key_type *)&s_1);
            if (*pmVar33 < 2) {
              pmVar33 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](&readCountMap,(key_type *)&s_1);
              if (*pmVar33 == 1) {
                pAVar34 = *(AlignmentRecord **)local_1118._0_8_;
                pAVar34->uniqueSupport = pAVar34->uniqueSupport + 1;
                goto LAB_0016922e;
              }
            }
            else {
              pAVar34 = *(AlignmentRecord **)local_1118._0_8_;
LAB_0016922e:
              pAVar34->support = pAVar34->support + 1;
            }
            lVar47 = std::__cxx11::string::find((char *)&s_1,0x1ae825);
            iVar48 = iVar48 + (uint)(lVar47 != -1);
            lVar47 = std::__cxx11::string::find((char *)&s_1,0x1ae82d);
            iVar19 = iVar19 + (uint)(lVar47 != -1);
          }
          std::__cxx11::string::~string((string *)&s_1);
        }
        if ((iVar48 == 0) || (iVar19 == 0)) {
          iVar35 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&trueReadsUniqueSupportMap._M_t,
                          &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
          if ((_Rb_tree_header *)iVar35._M_node ==
              &trueReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header) {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&trueReadsUniqueSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
            *pmVar33 = 1;
          }
          else {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&trueReadsUniqueSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
            iVar19 = *pmVar33;
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&trueReadsUniqueSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
            *pmVar33 = iVar19 + 1;
          }
          poVar21 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&words,
                               (*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
          std::endl<char,std::char_traits<char>>(poVar21);
          iVar35 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&trueReadsSupportMap._M_t,
                          &(*(AlignmentRecord **)local_1118._0_8_)->support);
          if ((_Rb_tree_header *)iVar35._M_node ==
              &trueReadsSupportMap._M_t._M_impl.super__Rb_tree_header) {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&trueReadsSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->support);
            *pmVar33 = 1;
          }
          else {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&trueReadsSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->support);
            iVar19 = *pmVar33;
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&trueReadsSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->support);
            *pmVar33 = iVar19 + 1;
          }
          this_02 = (ostream *)&osSupportTrue;
        }
        else {
          iVar35 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&errorReadsUniqueSupportMap._M_t,
                          &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
          if ((_Rb_tree_header *)iVar35._M_node ==
              &errorReadsUniqueSupportMap._M_t._M_impl.super__Rb_tree_header) {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&errorReadsUniqueSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
            *pmVar33 = 1;
          }
          else {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&errorReadsUniqueSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
            iVar19 = *pmVar33;
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&errorReadsUniqueSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
            *pmVar33 = iVar19 + 1;
          }
          poVar21 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&ia_line,
                               (*(AlignmentRecord **)local_1118._0_8_)->uniqueSupport);
          std::endl<char,std::char_traits<char>>(poVar21);
          iVar35 = std::
                   _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   ::find(&errorReadsSupportMap._M_t,
                          &(*(AlignmentRecord **)local_1118._0_8_)->support);
          if ((_Rb_tree_header *)iVar35._M_node ==
              &errorReadsSupportMap._M_t._M_impl.super__Rb_tree_header) {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&errorReadsSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->support);
            *pmVar33 = 1;
          }
          else {
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&errorReadsSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->support);
            iVar19 = *pmVar33;
            pmVar33 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](&errorReadsSupportMap,
                                 &(*(AlignmentRecord **)local_1118._0_8_)->support);
            *pmVar33 = iVar19 + 1;
          }
          this_02 = (ostream *)&insertion_words;
        }
        poVar21 = (ostream *)
                  std::ostream::operator<<(this_02,(*(AlignmentRecord **)local_1118._0_8_)->support)
        ;
        std::endl<char,std::char_traits<char>>(poVar21);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&consistingReads_1);
        std::_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**>::operator++
                  ((_Self *)&s_1,
                   (_Deque_iterator<AlignmentRecord_*,_AlignmentRecord_*&,_AlignmentRecord_**> *)
                   local_1118,0);
        _Var31._M_current =
             (char *)(__range1->
                     super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
                     _M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      std::ofstream::close();
      std::ofstream::close();
      std::ofstream::close();
      std::ofstream::close();
      if (!bVar16) {
        std::operator+(&s_1,&outfile,"UniqueError");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1118,&s_1,".txt");
        remove((char *)local_1118._0_8_);
        std::__cxx11::string::~string((string *)local_1118);
        std::__cxx11::string::~string((string *)&s_1);
        std::operator+(&s_1,&outfile,"UniqueTrue");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1118,&s_1,".txt");
        remove((char *)local_1118._0_8_);
        std::__cxx11::string::~string((string *)local_1118);
        std::__cxx11::string::~string((string *)&s_1);
        std::operator+(&s_1,&outfile,"SupportError");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1118,&s_1,".txt");
        remove((char *)local_1118._0_8_);
        std::__cxx11::string::~string((string *)local_1118);
        std::__cxx11::string::~string((string *)&s_1);
        std::operator+(&s_1,&outfile,"SupportTrue");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1118,&s_1,".txt");
        remove((char *)local_1118._0_8_);
        std::__cxx11::string::~string((string *)local_1118);
        std::__cxx11::string::~string((string *)&s_1);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&errorReadsUniqueSupportMap._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&errorReadsSupportMap._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&trueReadsUniqueSupportMap._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&trueReadsSupportMap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&readCountMap._M_t);
      std::ofstream::~ofstream(&osSupportTrue);
      std::ofstream::~ofstream(&insertion_words);
      std::ofstream::~ofstream(&words);
      std::ofstream::~ofstream(&ia_line);
    }
    printReads((ostream *)&os,__range1,local_10e0);
    if (bVar15) {
      std::__cxx11::string::string((string *)&local_c40,(string *)&outfile);
      printBAM(&local_c40,__range1,&header,&references,uniqueSupportFilter);
      std::__cxx11::string::~string((string *)&local_c40);
      if (bVar16) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&words,
                       &outfile,"Reads.txt");
        std::ofstream::ofstream(&ia_line,(string *)&words,_S_out);
        std::__cxx11::string::~string((string *)&words);
        printConsistingReads((ostream *)&ia_line,__range1,uniqueSupportFilter);
        std::ofstream::~ofstream(&ia_line);
      }
    }
    poVar21 = std::operator<<((ostream *)&std::cout,"final: ");
    std::deque<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::size(__range1);
    poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
    std::endl<char,std::char_traits<char>>(poVar21);
    ppAVar50 = (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppAVar40 = (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Deque_impl_data._M_start._M_last;
    pppAVar44 = (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>)
                ._M_impl.super__Deque_impl_data._M_start._M_node;
    ppAVar2 = (__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    while (ppAVar50 != ppAVar2) {
      pAVar34 = *ppAVar50;
      if (pAVar34 != (AlignmentRecord *)0x0) {
        AlignmentRecord::~AlignmentRecord(pAVar34);
      }
      operator_delete(pAVar34);
      ppAVar50 = ppAVar50 + 1;
      if (ppAVar50 == ppAVar40) {
        ppAVar50 = pppAVar44[1];
        pppAVar44 = pppAVar44 + 1;
        ppAVar40 = ppAVar50 + 0x40;
      }
    }
    std::_Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>::~_Deque_base
              (&__range1->super__Deque_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>);
    operator_delete(__range1);
    pLVar28 = local_10f0;
    if (this_00 != (long *)0x0) {
      std::ofstream::close();
      (**(code **)(*this_00 + 8))(this_00);
    }
    (*(local_10f8->super_EdgeCalculator)._vptr_EdgeCalculator[1])();
    if (pLVar28 != (LogWriter *)0x0) {
      (*pLVar28->_vptr_LogWriter[1])(pLVar28);
    }
    (*(this_01->super_CliqueFinder)._vptr_CliqueFinder[1])();
    lVar47 = std::cout;
    *(undefined8 *)(BamTools::SamReadGroup::SamReadGroup + *(long *)(std::cout + -0x18)) = 3;
    *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar47 + -0x18)) =
         *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar47 + -0x18)) &
         0xfffffefb | 4;
    cVar36 = clock();
    std::operator<<((ostream *)&std::cout,"time: ");
    poVar21 = std::ostream::_M_insert<double>((double)(cVar36 - cVar26) / 1000000.0);
    std::endl<char,std::char_traits<char>>(poVar21);
    std::ofstream::~ofstream(&os);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&appearanceMap._M_t);
    CliqueCollector::~CliqueCollector(&collector);
    iVar19 = 0;
  }
  else {
    _os = (pointer)0xbff0000000000000;
    ia_line._M_dataplus._M_p = (pointer)0xbff0000000000000;
    bVar17 = read_mean_and_sd(&mean_and_sd_filename,(double *)&os,(double *)&ia_line);
    if (bVar17) {
      std::operator<<((ostream *)&std::cerr,"Null distribution: mean ");
      insert_size_mean._M_p = _os;
      poVar21 = std::ostream::_M_insert<double>((double)_os);
      std::operator<<(poVar21,", sd ");
      insert_size_stddev = ia_line._M_dataplus;
      poVar21 = std::ostream::_M_insert<double>((double)ia_line._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>(poVar21);
      this = (GaussianEdgeCalculator *)operator_new(0x30);
      GaussianEdgeCalculator::GaussianEdgeCalculator
                (this,0.2,(double)insert_size_mean._M_p,(double)insert_size_stddev._M_p);
      this_00 = (long *)operator_new(0x200);
      std::ofstream::ofstream(this_00,indel_output_file._M_dataplus._M_p,_S_out);
      goto LAB_00167ee7;
    }
    poVar21 = std::operator<<((ostream *)&std::cerr,"Error reading \"");
    poVar21 = std::operator<<(poVar21,(string *)&mean_and_sd_filename);
    poVar21 = std::operator<<(poVar21,"\".");
    std::endl<char,std::char_traits<char>>(poVar21);
    iVar19 = 1;
  }
  std::
  unique_ptr<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>,_std::default_delete<std::vector<mean_and_stddev_t,_std::allocator<mean_and_stddev_t>_>_>_>
  ::~unique_ptr(&readgroup_params);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&references);
  BamTools::SamHeader::~SamHeader(&header);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&originalReadNames);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&simpson_map._M_h);
LAB_00168ab0:
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&switchRateRS._M_h);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&switchRateFS._M_h);
  std::__cxx11::string::~string((string *)&reference_path);
  std::__cxx11::string::~string((string *)&logfile);
  std::__cxx11::string::~string((string *)&indel_output_file);
  std::__cxx11::string::~string((string *)&indel_edge_cutoff);
  std::__cxx11::string::~string((string *)&mean_and_sd_filename);
  std::__cxx11::string::~string((string *)&allel_frequencies_path);
  std::__cxx11::string::~string((string *)&outfile);
  std::__cxx11::string::~string((string *)&bamfile);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
  ::~_Rb_tree(&args._M_t);
  return iVar19;
}

Assistant:

int main(int argc, char* argv[]) {
    cout<<"in main"<<endl;
    map<std::string, docopt::value> args
        = docopt::docopt(USAGE,
                         { argv + 1, argv + argc },
                         false);
    for(auto elem : args)
    {
    cout << elem.first << " " << elem.second << "\n";
    }

    // PARAMETERS
    string bamfile = args["<bamfile>"].asString();
    string outfile = "chromatypes.fasta";
    if (args["<output>"]) outfile = args["<output>"].asString();
    double edge_quasi_cutoff_cliques = 0.99; //stod(args["--edge_quasi_cutoff_cliques"].asString());
    double edge_quasi_cutoff_single = 0.95; //stod(args["--edge_quasi_cutoff_single"].asString());
    double edge_quasi_cutoff_mixed = 0.97; //stod(args["--edge_quasi_cutoff_mixed"].asString());
    double Q = 0.9;//stod(args["--random_overlap_quality"].asString());
    double overlap_cliques = 0.9; //stod(args["--min_overlap_cliques"].asString());
    double overlap_single = 0.6;//stod(args["--min_overlap_single"].asString());
    bool frameshift_merge; // args["--frame_shift_merge"].asBool();
    string allel_frequencies_path = "";
    if (args["--allel_frequencies"]) allel_frequencies_path = args["--allel_frequencies"].asString();
    string mean_and_sd_filename = "";
    if (args["--mean_and_sd_filename"]) mean_and_sd_filename = args["--mean_and_sd_filename"].asString();
    string indel_edge_cutoff;
    double indel_edge_sig_level = 0.2; //stod(args["--indel_edge_sig_level"].asString());
    string indel_output_file = "";
    if (args["--call_indels"]) indel_output_file = args["--call_indels"].asString();
    int iterations = stoi(args["--iterations"].asString());
    double filter = 0.0;// stod(args["--filter"].asString());
    double significance = 3.0; //stod(args["--significance"].asString());
    bool filter_singletons = args["--no_singletons"].asBool();
    string logfile = "";
    if (args["--log"]) logfile = args["--log"].asString();
    int doc_haplotypes = 0;
    if (args["--doc_haplotypes"]) doc_haplotypes = stoi(args["--doc_haplotypes"].asString());
    bool noProb0 = false; //args["--noProb0"].asBool();
    //-ot CHAR --output_type=CHAR
    bool bam = args["--bam"].asBool();
    bool analysisFiles = args["--analysisFiles"].asBool();
    bool nome = args["--nome"].asBool();
    double nomeParam = stod(args["--nomeParam"].asString());
    double uniqueSupportFilter = stod(args["--uniqueSupportFilter"].asString());
    double minOverlap = stod(args["--minOverlap"].asString());
    string reference_path;
    if (args["--ref"]) reference_path = args["--ref"].asString();

    //Read switch rates for both forward and reverse strand
    std::unordered_map<int, double> switchRateFS = readSwitchRateFile(args["--FS"].asString());
    std::unordered_map<int, double> switchRateRS = readSwitchRateFile(args["--RS"].asString());

    // END PARAMETERS

    bool call_indels = indel_output_file.size() > 0;
    if (call_indels && (mean_and_sd_filename.size() == 0)) {
        //cout<<"s1: "<<s1<<endl;
        //cout<<"s2: "<<s2<<endl;
        cerr << "Error: when using option -I, option -M must also be given." << endl;
        return 1;
    }

    //read allel frequency distributions
    std::unordered_map<int, double> simpson_map;
    unsigned int maxPosition2 = 0;
    //cerr << "PARSE PRIOR";
    cerr.flush();
    if (allel_frequencies_path.size() > 0) {
        ifstream ia(allel_frequencies_path.c_str());
        string ia_line;
        while (getline(ia, ia_line)) {
            std::vector<std::string> words;
            trim_right(ia_line);
            boost::split(words, ia_line, boost::is_any_of("\t"), boost::token_compress_on);

            std::vector<std::string> insertion_words;
            boost::split(insertion_words, words[0], boost::is_any_of("\\."), boost::token_compress_on);
            if (insertion_words.size() > 1) {
            } else {
                simpson_map[atoi(words[0].c_str())] = std::log10(pow(atof(words[1].c_str()),2)+pow(atof(words[2].c_str()),2)+pow(atof(words[3].c_str()),2)+pow(atof(words[4].c_str()),2));
                maxPosition2=atoi(words[0].c_str());
                //cerr << simpson_map[atoi(words[0].c_str())] << endl;
            }
        }
        ia.close();
    }
    //cout << "PARSE PRIOR: done" << endl;


    clock_t clock_start = clock();
    vector<string> originalReadNames;
    unsigned int maxPosition1;
    BamTools::SamHeader header;
    BamTools::RefVector references;
    deque<AlignmentRecord*>* reads = readBamFile(bamfile, originalReadNames,maxPosition1,header,references,reference_path);
    EdgeCalculator* edge_calculator = nullptr;
    EdgeCalculator* indel_edge_calculator = nullptr;
    unique_ptr<vector<mean_and_stddev_t> > readgroup_params(nullptr);
    maxPosition1 = (maxPosition1>maxPosition2) ? maxPosition1 : maxPosition2;

    if(nome){
        edge_calculator = new NoMeEdgeCalculator(nomeParam , switchRateFS , switchRateRS);
    }else{
        edge_calculator = new NewEdgeCalculator(Q, edge_quasi_cutoff_cliques, overlap_cliques, frameshift_merge, simpson_map, edge_quasi_cutoff_single, overlap_single, edge_quasi_cutoff_mixed, maxPosition1, noProb0);
    }
    if (call_indels) {
        double insert_mean = -1.0;
        double insert_stddev = -1.0;
        if (!read_mean_and_sd(mean_and_sd_filename, &insert_mean, &insert_stddev)) {
            cerr << "Error reading \"" << mean_and_sd_filename << "\"." << endl;
            return 1;
        }
        cerr << "Null distribution: mean " << insert_mean << ", sd " <<  insert_stddev << endl;
        indel_edge_calculator = new GaussianEdgeCalculator(indel_edge_sig_level,insert_mean,insert_stddev);
    }
    std::ofstream* indel_os = nullptr;
    if (call_indels) {
        indel_os = new ofstream(indel_output_file.c_str());
    }
    LogWriter* lw = nullptr;
    if (logfile != "") lw = new LogWriter(logfile);

    CliqueCollector collector(lw);
    CliqueFinder* clique_finder;

//    if (args["bronkerbosch"].asBool()) {
//        clique_finder = new BronKerbosch(*edge_calculator, collector, lw);
//    } else {
//        clique_finder = new CLEVER(*edge_calculator, collector, lw);
//    }

    clique_finder = new CLEVER(*edge_calculator, collector, lw);
    if (indel_edge_calculator != 0) {
        clique_finder->setSecondEdgeCalculator(indel_edge_calculator);
    }
    ofstream* reads_ofstream = 0;




//    cout<<"befor main loop"<<endl;
    // Main loop
    int ct = 0;
    double stdev = 1.0;
    auto filter_fn = [&](unique_ptr<AlignmentRecord>& read, int size) {

        return (ct == 1 and filter_singletons and read->getReadCount() <= 1) or (ct > 1 and significance != 0.0 and read->getProbability() < 1.0 / size - significance*stdev);
    };
    int edgecounter = 0;
    int nonEdgeCounter = 0;

    cout << "start: " << originalReadNames.size();
    int prevReadsSize = 0;
    int numAllowedGCPos = minOverlap;
    std::map<string,int> appearanceMap;
    while (ct != iterations) {
        if(appearanceMap.size()!=0){
            appearanceMap.clear();
        }
        clique_finder->initialize(&appearanceMap);

        if (lw != nullptr) lw->initialize();
        int size = reads->size();
        prevReadsSize = reads->size();


        while(not reads->empty()) {

            assert(reads->front() != nullptr);

            unique_ptr<AlignmentRecord> al_ptr(reads->front());

            reads->pop_front();
            if (filter_fn(al_ptr,size)) continue;
//            if(ct>0){
//                cout<<al_ptr->getName()<<endl;
//            }
            clique_finder->addAlignment(al_ptr,edgecounter,nonEdgeCounter,numAllowedGCPos,ct);

            //cout << "addAlignment " << ct << endl;

        }
        if(numAllowedGCPos>2){
            numAllowedGCPos--;
        }

        cout << "\tedges: " << edgecounter;
        cout << "\tnonEdges: " << nonEdgeCounter<<endl;


        delete reads;

        clique_finder->finish();
        reads = collector.finish();
        if (lw != nullptr) lw->finish();

        stdev = setProbabilities(*reads);
        if (clique_finder->hasConverged()) break;
        cout << ct++ << ": " << reads->size();
        edgecounter = 0;
        nonEdgeCounter = 0;
    }

    // Filter superreads according to read probability
    if (filter > 0.0) {
        auto filter_fn = [&](AlignmentRecord* al) { return al->getProbability() < filter;};
        auto new_end_it = std::remove_if(reads->begin(), reads->end(), filter_fn);
        for (auto it = new_end_it; it != reads->end(); it++) {
            delete *it;
            *it = nullptr;
        }
        reads->erase(new_end_it, reads->end());
    }
    ofstream os(outfile + ".fasta", std::ofstream::out);
    setProbabilities(*reads);
    //Filter superreads according to unique support information
    if(uniqueSupportFilter > -1){
        ofstream osUniqueError(outfile + "UniqueError" + ".txt",std::ofstream::out);
        ofstream osUniqueTrue(outfile + "UniqueTrue" + ".txt",std::ofstream::out);
        ofstream osSupportError(outfile + "SupportError" + ".txt",std::ofstream::out);
        ofstream osSupportTrue(outfile + "SupportTrue" + ".txt",std::ofstream::out);
        std::map<string,int> readCountMap;
        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    string token = s;
                    token.erase(token.begin(), std::find_if(token.begin(), token.end(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))));
                    token.erase(std::find_if(token.rbegin(), token.rend(),
                                std::not1(std::ptr_fun<int, int>(std::isspace))).base(), token.end());
                    if(readCountMap.find(token)!=readCountMap.end()){
                        readCountMap.operator[](token) = readCountMap.operator[](token) + 1;
                    }else{
                        readCountMap.operator[](token) = 1;
                    }
                }
            }
        }


        int errorCount = 0;
        int totalCount = 0;
        int errorWithNoUnique = 0;
        int trueWithNoUnique = 0;

        std::map<int,int> trueReadsSupportMap;
        std::map<int,int> trueReadsUniqueSupportMap;
        std::map<int,int> errorReadsSupportMap;
        std::map<int,int> errorReadsUniqueSupportMap;


        for (auto it = reads->begin(); it != reads->end(); it++) {
            vector<string> consistingReads = (*it)->getConsistingReads();
            //cout<<(*it)->getName()<<"    "<<endl;
            int chroma1 = 0;
            int chroma2 = 0;
            for(auto s : consistingReads){
                if((s.find("End")==std::string::npos) && (s.find("Clique")==std::string::npos)){
                    if(readCountMap[s]>1){
                        (*it)->support += 1;
                    }else if(readCountMap[s]==1){
                        (*it)->uniqueSupport += 1;
                        (*it)->support += 1;
                    }

                    if(s.find("chroma1")!=string::npos) chroma1++;
                    if(s.find("chroma2")!=string::npos) chroma2++;
                }
            }

            if(chroma1!=0 && chroma2!=0){
              errorCount++;
              if((*it)->uniqueSupport==uniqueSupportFilter)errorWithNoUnique++;
              if(errorReadsUniqueSupportMap.find((*it)->uniqueSupport)!=errorReadsUniqueSupportMap.end()){
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = errorReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
              }else{
                  errorReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
              }
              osUniqueError<<(*it)->uniqueSupport<<endl;
              if(errorReadsSupportMap.find((*it)->support)!=errorReadsSupportMap.end()){
                  errorReadsSupportMap[(*it)->support] = errorReadsSupportMap[(*it)->support] + 1;
              }else{
                  errorReadsSupportMap[(*it)->support] = 1;
              }
              osSupportError<<(*it)->support<<endl;
            }else{
               if((*it)->uniqueSupport==uniqueSupportFilter)trueWithNoUnique++;
               if(trueReadsUniqueSupportMap.find((*it)->uniqueSupport)!=trueReadsUniqueSupportMap.end()){
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = trueReadsUniqueSupportMap[(*it)->uniqueSupport] + 1;
               }else{
                   trueReadsUniqueSupportMap[(*it)->uniqueSupport] = 1;
               }
               osUniqueTrue<<(*it)->uniqueSupport<<endl;
               if(trueReadsSupportMap.find((*it)->support)!=trueReadsSupportMap.end()){
                   trueReadsSupportMap[(*it)->support] = trueReadsSupportMap[(*it)->support] + 1;
               }else{
                   trueReadsSupportMap[(*it)->support] = 1;
               }
               osSupportTrue<<(*it)->support<<endl;
            }
            totalCount++;
        }

        osUniqueError.close();
        osSupportError.close();
        osUniqueTrue.close();
        osSupportTrue.close();
        if(!analysisFiles){
            std::remove((outfile + "UniqueError" + ".txt").c_str());
            std::remove((outfile + "UniqueTrue" + ".txt").c_str());
            std::remove((outfile + "SupportError" + ".txt").c_str());
            std::remove((outfile + "SupportTrue" + ".txt").c_str());
        }
    }

    printReads(os, *reads, doc_haplotypes);

    if (bam){
        //cout<<outfile+".bam"<<endl;
//        ofstream os2(outfile + ".bam",std::ofstream::out);
        printBAM(outfile,*reads,header,references,uniqueSupportFilter);
        if(analysisFiles){
            ofstream os3(outfile + "Reads.txt",std::ofstream::out);
            printConsistingReads(os3, *reads,uniqueSupportFilter);
        }
    }


    cout << "final: " << reads->size() << endl;

    for (auto&& r : *reads) {

        delete r;
    }

    delete reads;

    if (indel_os != nullptr) {
        indel_os->close();
        delete indel_os;
    }
    if (edge_calculator != nullptr) delete edge_calculator;
    if (lw != nullptr) delete lw;
    if (clique_finder != nullptr) delete clique_finder;
    if (reads_ofstream != nullptr) {
        delete reads_ofstream;
    }
    cout.precision(3);
    cout << std::fixed;
    double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
    cout << "time: " <<  cpu_time << endl;
    return 0;
}